

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O1

int archive_write_client_write(archive_write_filter *f,void *_buff,size_t length)

{
  ulong *puVar1;
  archive *a;
  ulong *puVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  a = f->archive;
  puVar2 = (ulong *)f->data;
  if (*puVar2 == 0) {
    if ((long)length < 1) {
      return 0;
    }
    while (lVar4 = (**(code **)&a[1].file_count)(a,a[1].error_string.s,_buff,length), 0 < lVar4) {
      _buff = (void *)((long)_buff + lVar4);
      sVar5 = length - lVar4;
      bVar8 = (long)length < lVar4;
      length = sVar5;
      if (sVar5 == 0 || bVar8) {
        return 0;
      }
    }
  }
  else {
    uVar6 = puVar2[1];
    if (uVar6 < *puVar2) {
      if (length <= uVar6) {
        uVar6 = length;
      }
      memcpy((void *)puVar2[3],_buff,uVar6);
      puVar2[3] = puVar2[3] + uVar6;
      _buff = (void *)((long)_buff + uVar6);
      length = length - uVar6;
      puVar1 = puVar2 + 1;
      *puVar1 = *puVar1 - uVar6;
      if (*puVar1 == 0) {
        uVar6 = *puVar2;
        bVar8 = uVar6 == 0;
        if (!bVar8) {
          uVar7 = puVar2[2];
          do {
            uVar3 = (**(code **)&a[1].file_count)(a,a[1].error_string.s,uVar7,uVar6);
            if ((long)uVar3 < 1) goto LAB_0016c306;
            if (uVar6 < uVar3) {
              archive_set_error(a,-1,"write overrun");
              goto LAB_0016c306;
            }
            uVar7 = uVar7 + uVar3;
            uVar6 = uVar6 - uVar3;
            bVar8 = uVar6 == 0;
          } while (!bVar8);
        }
        puVar2[3] = puVar2[2];
        puVar2[1] = *puVar2;
LAB_0016c306:
        if (!bVar8) {
          return -0x1e;
        }
      }
    }
    while( true ) {
      if (length < *puVar2) {
        if ((long)length < 1) {
          return 0;
        }
        memcpy((void *)puVar2[3],_buff,length);
        puVar2[3] = puVar2[3] + length;
        puVar2[1] = puVar2[1] - length;
        return 0;
      }
      lVar4 = (**(code **)&a[1].file_count)(a,a[1].error_string.s,_buff);
      if (lVar4 < 1) break;
      _buff = (void *)((long)_buff + lVar4);
      length = length - lVar4;
    }
  }
  return -0x1e;
}

Assistant:

static int
archive_write_client_write(struct archive_write_filter *f,
    const void *_buff, size_t length)
{
	struct archive_write *a = (struct archive_write *)f->archive;
        struct archive_none *state = (struct archive_none *)f->data;
	const char *buff = (const char *)_buff;
	ssize_t remaining, to_copy;
	ssize_t bytes_written;

	remaining = length;

	/*
	 * If there is no buffer for blocking, just pass the data
	 * straight through to the client write callback.  In
	 * particular, this supports "no write delay" operation for
	 * special applications.  Just set the block size to zero.
	 */
	if (state->buffer_size == 0) {
		while (remaining > 0) {
			bytes_written = (a->client_writer)(&a->archive,
			    a->client_data, buff, remaining);
			if (bytes_written <= 0)
				return (ARCHIVE_FATAL);
			remaining -= bytes_written;
			buff += bytes_written;
		}
		return (ARCHIVE_OK);
	}

	/* If the copy buffer isn't empty, try to fill it. */
	if (state->avail < state->buffer_size) {
		/* If buffer is not empty... */
		/* ... copy data into buffer ... */
		to_copy = ((size_t)remaining > state->avail) ?
			state->avail : (size_t)remaining;
		memcpy(state->next, buff, to_copy);
		state->next += to_copy;
		state->avail -= to_copy;
		buff += to_copy;
		remaining -= to_copy;
		/* ... if it's full, write it out. */
		if (state->avail == 0) {
			char *p = state->buffer;
			size_t to_write = state->buffer_size;
			while (to_write > 0) {
				bytes_written = (a->client_writer)(&a->archive,
				    a->client_data, p, to_write);
				if (bytes_written <= 0)
					return (ARCHIVE_FATAL);
				if ((size_t)bytes_written > to_write) {
					archive_set_error(&(a->archive),
					    -1, "write overrun");
					return (ARCHIVE_FATAL);
				}
				p += bytes_written;
				to_write -= bytes_written;
			}
			state->next = state->buffer;
			state->avail = state->buffer_size;
		}
	}

	while ((size_t)remaining >= state->buffer_size) {
		/* Write out full blocks directly to client. */
		bytes_written = (a->client_writer)(&a->archive,
		    a->client_data, buff, state->buffer_size);
		if (bytes_written <= 0)
			return (ARCHIVE_FATAL);
		buff += bytes_written;
		remaining -= bytes_written;
	}

	if (remaining > 0) {
		/* Copy last bit into copy buffer. */
		memcpy(state->next, buff, remaining);
		state->next += remaining;
		state->avail -= remaining;
	}
	return (ARCHIVE_OK);
}